

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1parse.c
# Opt level: O2

void mbedtls_asn1_sequence_free(mbedtls_asn1_sequence *seq)

{
  mbedtls_asn1_sequence *pmVar1;
  
  while (seq != (mbedtls_asn1_sequence *)0x0) {
    pmVar1 = seq->next;
    mbedtls_platform_zeroize(seq,0x20);
    free(seq);
    seq = pmVar1;
  }
  return;
}

Assistant:

void mbedtls_asn1_sequence_free( mbedtls_asn1_sequence *seq )
{
    while( seq != NULL )
    {
        mbedtls_asn1_sequence *next = seq->next;
        mbedtls_platform_zeroize( seq, sizeof( *seq ) );
        mbedtls_free( seq );
        seq = next;
    }
}